

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void * op_mem_stream_create(OpusFileCallbacks *_cb,uchar *_data,size_t _size)

{
  OpusMemStream *stream;
  size_t _size_local;
  uchar *_data_local;
  OpusFileCallbacks *_cb_local;
  
  if (_size < 0x8000000000000000) {
    _cb_local = (OpusFileCallbacks *)malloc(0x18);
    if (_cb_local != (OpusFileCallbacks *)0x0) {
      _cb->read = op_mem_read;
      _cb->seek = op_mem_seek;
      _cb->tell = op_mem_tell;
      _cb->close = op_mem_close;
      _cb_local->read = (op_read_func)_data;
      _cb_local->seek = (op_seek_func)_size;
      _cb_local->tell = (op_tell_func)0x0;
    }
  }
  else {
    _cb_local = (OpusFileCallbacks *)0x0;
  }
  return _cb_local;
}

Assistant:

void *op_mem_stream_create(OpusFileCallbacks *_cb,
 const unsigned char *_data,size_t _size){
  OpusMemStream *stream;
  if(_size>OP_MEM_SIZE_MAX)return NULL;
  stream=(OpusMemStream *)_ogg_malloc(sizeof(*stream));
  if(stream!=NULL){
    *_cb=*&OP_MEM_CALLBACKS;
    stream->data=_data;
    stream->size=_size;
    stream->pos=0;
  }
  return stream;
}